

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.cpp
# Opt level: O1

vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_> *
__thiscall
DisconnectedBlockTransactions::LimitMemoryUsage
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *__return_storage_ptr__,DisconnectedBlockTransactions *this)

{
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_00;
  long lVar1;
  const_iterator it_2;
  _List_node_base *p_Var2;
  long lVar3;
  const_iterator it;
  _List_node_base *p_Var4;
  ulong uVar5;
  ulong uVar6;
  _List_node_base *p_Var7;
  ulong uVar8;
  const_iterator it_1;
  _List_node_base *p_Var9;
  long lVar10;
  long in_FS_OFFSET;
  ulong uVar11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->queuedTx;
  p_Var7 = (this->queuedTx).
           super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)this_00) {
    uVar6 = 0;
    do {
      uVar5 = (this->iters_by_txid)._M_h._M_bucket_count;
      uVar8 = uVar5 * 8 + 0x1f & 0xfffffffffffffff0;
      if ((uVar5 & 0x1fffffffffffffff) == 0) {
        uVar8 = 0;
      }
      if ((this->iters_by_txid)._M_h._M_element_count * 0x40 + this->cachedInnerUsage +
          (this->queuedTx).
          super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl._M_node._M_size * 0x30 + uVar8 <= this->m_max_mem_usage) break;
      std::
      vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
      ::emplace_back<std::shared_ptr<CTransaction_const>&>
                ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                  *)__return_storage_ptr__,(shared_ptr<const_CTransaction> *)(p_Var7 + 1));
      p_Var7 = (this_00->
               super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
      if (p_Var7 == (_List_node_base *)0x0) {
        lVar3 = 0;
      }
      else {
        p_Var2 = *(_List_node_base **)((long)(p_Var7 + 1) + 8);
        uVar5 = (long)*(_List_node_base **)((long)(p_Var7 + 2) + 8) + (0x1fU - (long)p_Var2) &
                0xfffffffffffffff0;
        if (*(_List_node_base **)((long)(p_Var7 + 2) + 8) == p_Var2) {
          uVar5 = uVar6;
        }
        p_Var4 = p_Var7->_M_next;
        uVar8 = (long)p_Var7[1]._M_next + (0x1fU - (long)p_Var4) & 0xfffffffffffffff0;
        if (p_Var7[1]._M_next == p_Var4) {
          uVar8 = uVar6;
        }
        lVar3 = uVar8 + uVar5;
        for (; p_Var4 != p_Var7->_M_prev; p_Var4 = (_List_node_base *)((long)(p_Var4 + 6) + 8)) {
          p_Var9 = p_Var4[5]._M_next;
          uVar5 = (long)p_Var4[6]._M_next + (0x1f - (long)p_Var9) & 0xfffffffffffffff0;
          if (p_Var4[6]._M_next == p_Var9) {
            uVar5 = uVar6;
          }
          uVar8 = (ulong)*(uint *)&p_Var4[3]._M_next;
          if (*(uint *)((long)(p_Var4 + 4) + 4) < 0x1d) {
            uVar8 = uVar6;
          }
          uVar11 = uVar8 + 0x1f & 0x1fffffff0;
          if ((int)uVar8 == 0) {
            uVar11 = uVar6;
          }
          lVar10 = uVar11 + uVar5;
          for (; p_Var9 != *(_List_node_base **)((long)(p_Var4 + 5) + 8);
              p_Var9 = (_List_node_base *)((long)(p_Var9 + 1) + 8)) {
            uVar5 = 0;
            if (p_Var9[1]._M_next != p_Var9->_M_next) {
              uVar5 = ((long)p_Var9[1]._M_next - (long)p_Var9->_M_next) + 0x1fU & 0xfffffffffffffff0
              ;
            }
            lVar10 = lVar10 + uVar5;
          }
          lVar3 = lVar3 + lVar10;
        }
        for (; p_Var2 != p_Var7[2]._M_next; p_Var2 = (_List_node_base *)((long)(p_Var2 + 2) + 8)) {
          uVar5 = (ulong)*(uint *)&p_Var2[1]._M_next;
          if (*(uint *)((long)(p_Var2 + 2) + 4) < 0x1d) {
            uVar5 = uVar6;
          }
          uVar8 = 0;
          if ((int)uVar5 != 0) {
            uVar8 = uVar5 + 0x1f & 0x1fffffff0;
          }
          lVar3 = lVar3 + uVar8;
        }
        lVar3 = lVar3 + 0xc0;
      }
      this->cachedInnerUsage = this->cachedInnerUsage - lVar3;
      std::
      _Hashtable<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->iters_by_txid)._M_h,(long)(p_Var7 + 3) + 9);
      std::__cxx11::
      list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::_M_erase(this_00,(this_00->
                         super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         )._M_impl._M_node.super__List_node_base._M_next);
      p_Var7 = (this_00->
               super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var7 != (_List_node_base *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CTransactionRef> DisconnectedBlockTransactions::LimitMemoryUsage()
{
    std::vector<CTransactionRef> evicted;

    while (!queuedTx.empty() && DynamicMemoryUsage() > m_max_mem_usage) {
        evicted.emplace_back(queuedTx.front());
        cachedInnerUsage -= RecursiveDynamicUsage(queuedTx.front());
        iters_by_txid.erase(queuedTx.front()->GetHash());
        queuedTx.pop_front();
    }
    return evicted;
}